

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool aedit_prog(CHAR_DATA *ch,char *argument)

{
  improg_type *piVar1;
  long *plVar2;
  AREA_DATA_conflict *area;
  bool bVar3;
  bool bVar4;
  uint clearmem;
  char *argument_00;
  APROG_DATA *pAVar5;
  long lVar6;
  uint uVar7;
  improg_type *piVar8;
  char ***pppcVar9;
  char **ppcVar10;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_string_view<char> fmt_02;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_02;
  string buffer;
  char prog [4608];
  char prog_type [4608];
  char add [4608];
  char buf [4608];
  char *local_4b38;
  undefined8 local_4b30;
  char local_4b28;
  undefined7 uStack_4b27;
  char ***local_4b18 [2];
  char **local_4b08 [2];
  char ***local_4af8 [2];
  char **local_4ae8 [3];
  buffer<char> local_4ad0;
  char local_4ab0 [504];
  char **local_48b8 [576];
  char **local_36b8 [576];
  char local_24b8 [4608];
  char local_12b8 [4744];
  
  local_4b38 = &local_4b28;
  local_4b30 = 0;
  local_4b28 = '\0';
  if (*argument == '\0') {
    send_to_char("The following area programs are available:\n\r",ch);
    ppcVar10 = &aprog_table[0].name;
    uVar7 = 0;
    do {
      if (ch->pcdata->security < 10) {
        bVar4 = str_cmp(ch->in_room->area->name,ppcVar10[2]);
        if (!bVar4) {
          sprintf(local_12b8,"%s ",*ppcVar10);
          send_to_char(local_12b8,ch);
          goto LAB_0036141e;
        }
      }
      else {
        sprintf(local_12b8,"%s ",*ppcVar10);
        send_to_char(local_12b8,ch);
LAB_0036141e:
        uVar7 = uVar7 + 1;
      }
      if (0 < (int)uVar7 && (uVar7 & 3) == 0) {
        send_to_char("\n\r",ch);
      }
      plVar2 = (long *)(ppcVar10 + 3);
      ppcVar10 = ppcVar10 + 4;
    } while (*plVar2 != 0);
    if ((uVar7 & 3) == 0) {
      bVar4 = true;
    }
    else {
      send_to_char("\n\r",ch);
      bVar4 = true;
    }
    goto LAB_00361636;
  }
  area = (AREA_DATA_conflict *)ch->desc->pEdit;
  argument_00 = one_argument(argument,local_24b8);
  one_argument(argument_00,(char *)local_48b8);
  if ((char)local_48b8[0] == '\0') {
    send_to_char("Syntax: prog add <prog_name>\n\r        prog del <prog_name>\n\r",ch);
  }
  else {
    if (area->aprogs == (APROG_DATA *)0x0) {
      pAVar5 = (APROG_DATA *)operator_new(0x60);
      area->aprogs = pAVar5;
      lVar6 = 0;
      do {
        *(undefined1 *)((long)&area->aprogs->pulse_prog + lVar6) = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x60);
    }
    piVar8 = aprog_table;
    bVar4 = false;
    do {
      bVar3 = str_cmp(piVar8->name,(char *)local_48b8);
      if (!bVar3) {
        strcpy((char *)local_36b8,piVar8->type);
        bVar4 = true;
      }
      piVar1 = piVar8 + 1;
      piVar8 = piVar8 + 1;
    } while (piVar1->type != (char *)0x0);
    if (bVar4) {
      bVar4 = str_prefix(local_24b8,"add");
      if (bVar4) {
        bVar3 = str_prefix(local_24b8,"del");
        bVar4 = true;
        if (bVar3) goto LAB_00361636;
        bVar4 = aprog_unset(area,(char *)local_36b8,(char *)local_48b8);
        local_4af8[0] = local_36b8;
        if (!bVar4) {
          local_4ad0.ptr_ = local_4ab0;
          local_4ad0.size_ = 0;
          local_4ad0._vptr_buffer = (_func_int **)&PTR_grow_00457340;
          local_4ad0.capacity_ = 500;
          fmt_02.size_ = 0x1c;
          fmt_02.data_ = "The \'{}\' field is not set.\n\r";
          args_02.field_1.values_ =
               (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4af8;
          args_02.desc_ = 0xc;
          ::fmt::v9::detail::vformat_to<char>(&local_4ad0,fmt_02,args_02,(locale_ref)0x0);
          local_4b18[0] = local_4b08;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4b18,local_4ad0.ptr_,local_4ad0.ptr_ + local_4ad0.size_);
          goto LAB_003614e1;
        }
        local_4ad0.size_ = 0;
        local_4ad0._vptr_buffer = (_func_int **)&PTR_grow_00457340;
        local_4ad0.capacity_ = 500;
        fmt.size_ = 0x30;
        fmt.data_ = "The \'{}\' field for this area has been cleared.\n\r";
        args.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4af8;
        args.desc_ = 0xc;
        local_4ad0.ptr_ = local_4ab0;
        ::fmt::v9::detail::vformat_to<char>(&local_4ad0,fmt,args,(locale_ref)0x0);
        local_4b18[0] = local_4b08;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4b18,local_4ad0.ptr_,local_4ad0.ptr_ + local_4ad0.size_);
        if (local_4ad0.ptr_ != local_4ab0) {
          operator_delete(local_4ad0.ptr_,local_4ad0.capacity_);
        }
        std::__cxx11::string::operator=((string *)&local_4b38,(string *)local_4b18);
        local_4ae8[0] = local_4b08[0];
        pppcVar9 = local_4b18[0];
        if (local_4b18[0] != local_4b08) goto LAB_0036161f;
      }
      else {
        aprog_set(area,(char *)local_36b8,(char *)local_48b8);
        local_4ad0.size_ = 0;
        local_4ad0._vptr_buffer = (_func_int **)&PTR_grow_00457340;
        local_4ad0.capacity_ = 500;
        fmt_01.size_ = 0x3f;
        fmt_01.data_ = "The \'{}\' field for this area as been set to the \'{}\' program.\n\r";
        args_01.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4b18;
        args_01.desc_ = 0xcc;
        local_4b18[0] = local_36b8;
        local_4b08[0] = (char **)local_48b8;
        local_4ad0.ptr_ = local_4ab0;
        ::fmt::v9::detail::vformat_to<char>(&local_4ad0,fmt_01,args_01,(locale_ref)0x0);
        local_4af8[0] = local_4ae8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4af8,local_4ad0.ptr_,local_4ad0.ptr_ + local_4ad0.size_);
        if (local_4ad0.ptr_ != local_4ab0) {
          operator_delete(local_4ad0.ptr_,local_4ad0.capacity_);
        }
        std::__cxx11::string::operator=((string *)&local_4b38,(string *)local_4af8);
        pppcVar9 = local_4af8[0];
        if (local_4af8[0] != local_4ae8) {
LAB_0036161f:
          operator_delete(pppcVar9,(ulong)((long)local_4ae8[0] + 1));
        }
      }
      bVar4 = true;
      send_to_char(local_4b38,ch);
      goto LAB_00361636;
    }
    local_4af8[0] = local_48b8;
    local_4ad0.ptr_ = local_4ab0;
    local_4ad0.size_ = 0;
    local_4ad0._vptr_buffer = (_func_int **)&PTR_grow_00457340;
    local_4ad0.capacity_ = 500;
    fmt_00.size_ = 0x2b;
    fmt_00.data_ = "{} is not a valid program to choose from.\n\r";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4af8;
    args_00.desc_ = 0xc;
    ::fmt::v9::detail::vformat_to<char>(&local_4ad0,fmt_00,args_00,(locale_ref)0x0);
    local_4b18[0] = local_4b08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b18,local_4ad0.ptr_,local_4ad0.ptr_ + local_4ad0.size_);
LAB_003614e1:
    if (local_4ad0.ptr_ != local_4ab0) {
      operator_delete(local_4ad0.ptr_,local_4ad0.capacity_);
    }
    std::__cxx11::string::operator=((string *)&local_4b38,(string *)local_4b18);
    if (local_4b18[0] != local_4b08) {
      operator_delete(local_4b18[0],(ulong)((long)local_4b08[0] + 1));
    }
    send_to_char(local_4b38,ch);
  }
  bVar4 = false;
LAB_00361636:
  if (local_4b38 != &local_4b28) {
    operator_delete(local_4b38,CONCAT71(uStack_4b27,local_4b28) + 1);
  }
  return bVar4;
}

Assistant:

bool aedit_prog(CHAR_DATA *ch, char *argument)
{
	int count = 0, col = 0;
	char buf[MSL], add[MSL], prog[MSL], prog_type[MSL];
	std::string buffer;
	AREA_DATA *pArea;
	bool found = false;

	EDIT_AREA(ch, pArea);

	if (!*argument)
	{
		send_to_char("The following area programs are available:\n\r", ch);

		for (count = 0; aprog_table[count].type != nullptr; count++)
		{
			if (ch->pcdata->security < 10)
			{
				if (!str_cmp(ch->in_room->area->name, aprog_table[count].owner))
				{
					sprintf(buf, "%s ", aprog_table[count].name);
					send_to_char(buf, ch);
					col++;
				}
			}
			else
			{
				sprintf(buf, "%s ", aprog_table[count].name);
				send_to_char(buf, ch);
				col++;
			}

			if (col % 4 == 0 && col > 0)
				send_to_char("\n\r", ch);
		}
		if (col % 4 != 0)
			send_to_char("\n\r", ch);
	}
	else
	{
		argument = one_argument(argument, add);
		argument = one_argument(argument, prog);

		if (!*prog)
		{
			send_to_char("Syntax: prog add <prog_name>\n\r"\
						 "        prog del <prog_name>\n\r", ch);
			return false;
		}

		if (pArea->aprogs == nullptr)
		{
			pArea->aprogs = new APROG_DATA;
			CLEAR_MEM(pArea->aprogs, sizeof(APROG_DATA))
		}

		for (count = 0; aprog_table[count].type != nullptr; count++)
		{
			if (!str_cmp(aprog_table[count].name, prog))
			{
				sprintf(prog_type, "%s", aprog_table[count].type);
				found = true;
			}
		}

		if (!found)
		{
			buffer = fmt::format("{} is not a valid program to choose from.\n\r", prog); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);
			return false;
		}
		else if (!str_prefix(add, "add"))
		{
			aprog_set(pArea, prog_type, prog);
			buffer = fmt::format("The '{}' field for this area as been set to the '{}' program.\n\r", prog_type, prog);
			send_to_char(buffer.c_str(), ch);
		}
		else if (!str_prefix(add, "del"))
		{
			if (aprog_unset(pArea, prog_type, prog))
			{
				buffer = fmt::format("The '{}' field for this area has been cleared.\n\r", prog_type);
				send_to_char(buffer.c_str(), ch);
			}
			else
			{
				buffer = fmt::format("The '{}' field is not set.\n\r", prog_type);
				send_to_char(buffer.c_str(), ch);
				return false;
			}
		}
	}

	return true;
}